

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnMemoryCopyExpr
          (ExprVisitorDelegate *this,MemoryCopyExpr *expr)

{
  WatWriter *pWVar1;
  Index IVar2;
  char *s;
  
  pWVar1 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::MemoryCopy_Opcode);
  WritePutsSpace(pWVar1,s);
  pWVar1 = this->writer_;
  IVar2 = Module::GetMemoryIndex((pWVar1->super_ModuleContext).module,&expr->destmemidx);
  if (IVar2 == 0) {
    IVar2 = Module::GetMemoryIndex((pWVar1->super_ModuleContext).module,&expr->srcmemidx);
    if (IVar2 == 0) {
      pWVar1->next_char_ = Space;
      goto LAB_0013d199;
    }
  }
  WriteVar(pWVar1,&expr->destmemidx,Space);
  WriteVar(pWVar1,&expr->srcmemidx,Space);
LAB_0013d199:
  WriteNewline(this->writer_,false);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnMemoryCopyExpr(MemoryCopyExpr* expr) {
  writer_->WritePutsSpace(Opcode::MemoryCopy_Opcode.GetName());
  writer_->WriteTwoMemoryVarsUnlessBothZero(expr->destmemidx, expr->srcmemidx,
                                            NextChar::Space);
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}